

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O2

bool __thiscall ON_PolylineCurve::Reverse(ON_PolylineCurve *this)

{
  double *pdVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = ON_Polyline::PointCount(&this->m_pline);
  if (1 < (int)uVar2) {
    ON_SimpleArray<ON_3dPoint>::Reverse((ON_SimpleArray<ON_3dPoint> *)&this->m_pline);
    ON_SimpleArray<double>::Reverse(&this->m_t);
    pdVar1 = (this->m_t).m_a;
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      pdVar1[uVar3] = -pdVar1[uVar3];
    }
  }
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  return 1 < (int)uVar2;
}

Assistant:

bool
ON_PolylineCurve::Reverse()
{
  bool rc = false;
  const int count = PointCount();
  if ( count >= 2 ) {
    m_pline.Reverse();
    m_t.Reverse();
    double* t = m_t.Array();
    for ( int i = 0; i < count; i++ ) {
      t[i] = -t[i];
    }
    rc = true;
  }
	DestroyCurveTree();
  return rc;
}